

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parsing.h
# Opt level: O3

int __thiscall Parsing::getSymbol(Parsing *this)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  byte *pbVar6;
  size_type sVar7;
  ostream *this_00;
  long *plVar8;
  uint uVar9;
  const_iterator __end1;
  ulong uVar10;
  int iVar11;
  byte *pbVar12;
  byte *pbVar13;
  bool bVar14;
  int symbol;
  int number;
  string target;
  int local_80;
  int local_7c;
  string local_78;
  vector<Word,std::allocator<Word>> *local_58;
  string local_50;
  
  filter(this);
  pbVar12 = (byte *)(this->content)._M_dataplus._M_p;
  local_58 = (vector<Word,std::allocator<Word>> *)&this->words;
  do {
    pbVar6 = (byte *)((this->content)._M_dataplus._M_p + (this->content)._M_string_length);
    if (pbVar12 == pbVar6) {
      return 0;
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    do {
      if ((*pbVar12 != 0x20) && (pbVar13 = pbVar12, *pbVar12 != 9)) break;
      pbVar12 = pbVar12 + 1;
      pbVar13 = pbVar12;
    } while (pbVar12 != pbVar6);
    if (pbVar13 == pbVar6) {
      return 0;
    }
    bVar1 = *pbVar13;
    uVar10 = (ulong)bVar1;
    if (uVar10 < 0x3f) {
      bVar5 = false;
      bVar14 = true;
      bVar3 = true;
      if ((0xef0800000000U >> (uVar10 & 0x3f) & 1) == 0) {
        bVar3 = false;
        if ((0x7c00000000000000U >> (uVar10 & 0x3f) & 1) == 0) goto LAB_00104643;
      }
      else {
LAB_00104380:
        bVar14 = bVar3;
        bVar3 = '/' < (char)bVar1;
      }
    }
    else {
LAB_00104643:
      bVar14 = bVar1 == 0x2c;
      if ((char)bVar1 < '{') {
        if ((char)bVar1 < 'a') {
          if ('Z' < (char)bVar1) goto LAB_0010467c;
          bVar5 = '@' < (char)bVar1;
          bVar3 = bVar14;
          if ((char)bVar1 < ':') goto LAB_00104380;
        }
        else {
          bVar5 = true;
        }
      }
      else {
LAB_0010467c:
        bVar5 = false;
      }
      bVar3 = false;
    }
    pbVar12 = pbVar13;
    while( true ) {
      bVar2 = *pbVar12;
      if ((((bVar2 == 9) || (bVar2 == 0x20)) ||
          ((bVar5 && ((bVar2 < 0x3f && ((0x7c00ff0800000000U >> ((ulong)bVar2 & 0x3f) & 1) != 0)))))
          ) || (((char)bVar2 < '{' && !(bool)(bVar14 ^ 1) &&
                (('`' < (char)bVar2 ||
                 (((char)bVar2 < '[' && (('@' < (char)bVar2 || ((byte)(bVar2 - 0x30) < 10))))))))))
      break;
      if (bVar3) {
        if ((bVar2 < 0x3f) && ((0x7c00ff0800000000U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) break;
      }
      else {
        uVar9 = bVar2 - 0x23;
        if (((((byte)uVar9 < 0x1c) && ((0xf801fe1U >> (uVar9 & 0x1f) & 1) != 0)) &&
            (local_78._M_string_length != 0)) &&
           (((local_78._M_string_length != 1 || ((0x47fe01eU >> (uVar9 & 0x1f) & 1) == 0)) ||
            ((0x3e < bVar1 || ((0x5400000000000000U >> (uVar10 & 0x3f) & 1) == 0)))))) break;
      }
      std::__cxx11::string::push_back((char)&local_78);
      pbVar12 = pbVar12 + 1;
      if (pbVar12 == (byte *)((this->content)._M_dataplus._M_p + (this->content)._M_string_length))
      break;
    }
    local_80 = getReservation(this,&local_78);
    local_7c = 0;
    if (local_80 == -1) {
      if (local_78._M_string_length == 0) {
        local_80 = this->constBase;
        local_7c = 0;
      }
      else {
        sVar7 = 0;
        do {
          if (9 < (byte)(local_78._M_dataplus._M_p[sVar7] - 0x30U)) goto LAB_00104518;
          sVar7 = sVar7 + 1;
        } while (local_78._M_string_length != sVar7);
        local_80 = this->constBase;
        sVar7 = 0;
        local_7c = 0;
        do {
          local_7c = (int)local_78._M_dataplus._M_p[sVar7] + local_7c * 10 + -0x30;
          sVar7 = sVar7 + 1;
        } while (local_78._M_string_length != sVar7);
      }
LAB_00104518:
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      bVar5 = isIdentifier(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar5) {
        local_80 = this->identifierBase;
      }
    }
    iVar11 = (int)pbVar13 - *(int *)&(this->content)._M_dataplus._M_p;
    std::vector<Word,std::allocator<Word>>::emplace_back<std::__cxx11::string&,int&,int&,int&,int&>
              (local_58,&local_78,&local_80,&local_7c,
               (this->contentLine).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar11,
               (this->contentRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar11);
    iVar4 = local_80;
    if (local_80 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"parsing error in ",0x11);
      this_00 = (ostream *)
                std::ostream::operator<<
                          ((ostream *)&std::cout,
                           (this->contentLine).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start[iVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,":",1);
      plVar8 = (long *)std::ostream::operator<<
                                 (this_00,(this->contentRow).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[iVar11]);
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    if (iVar4 == -1) {
      return -1;
    }
  } while( true );
}

Assistant:

int getSymbol() {
		filter();
		auto now = content.begin();
		while (now != content.end()) {
			std::string target;

			while (now != content.end() && ISSPC(*now)) now++;
			auto nowPosition = now;
			if (now == content.end()) break;

			bool isDiv = ISDIV(*now);
			bool isLet = ISLET(*now);
			bool isNum = ISNUM(*now);
			char doubleDiv = *now;
			while (now != content.end() && ! ISSPC(*now)) {
				if (isLet && ISDIV(*now)) break;
				if (isDiv && (ISLET(*now) || ISNUM(*now))) break;
				if (isNum && ISDIV(*now)) break;
				if (ISDIV(*now)) {
					if (target.length() == 1) {
						if (*now == '='){
							if (doubleDiv != '<' && doubleDiv != '>' && doubleDiv != ':') break;
						} else break;
					} else if (target.length() >= 2) break;
				}
				target += *now;
				now++;
			}

			int symbol = getReservation(target);
			int number = 0;
			if (symbol == -1) {
				if (isNumber(target)) {
					symbol = constBase;
					number = getNumber(target);
				}
				if (isIdentifier(target)) symbol = identifierBase;
			}

			int targetPosition = nowPosition - content.begin();
			words.emplace_back(target, symbol, number, contentLine[targetPosition], contentRow[targetPosition]);

			if (symbol == -1) {
				std::cout << "parsing error in " << contentLine[targetPosition] <<
											 ":" << contentRow[targetPosition] << std::endl;
				return -1;
			}
		}
		return 0;
	}